

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCof.c
# Opt level: O2

Vec_Ptr_t * Cof_ManCollectHighFanout(Cof_Man_t *p,int nNodes)

{
  Cof_Obj_t *pNode;
  uint uVar1;
  Vec_Ptr_t *vNodes;
  void **ppvVar2;
  int iVar3;
  uint uVar4;
  
  vNodes = (Vec_Ptr_t *)malloc(0x10);
  iVar3 = 8;
  if (6 < nNodes - 1U) {
    iVar3 = nNodes;
  }
  vNodes->nSize = 0;
  vNodes->nCap = iVar3;
  uVar4 = 0;
  if (iVar3 == 0) {
    ppvVar2 = (void **)0x0;
  }
  else {
    ppvVar2 = (void **)malloc((long)iVar3 << 3);
  }
  vNodes->pArray = ppvVar2;
  while (((int)uVar4 < p->nObjData && (p->pObjData != (int *)0x0))) {
    pNode = (Cof_Obj_t *)(p->pObjData + uVar4);
    uVar1 = *(uint *)pNode;
    if (((uVar1 & 0xf1) == 1) || ((uVar1 & 0xf0) != 0 && (uVar1 & 1) == 0)) {
      Cof_ManInsertEntry_rec(vNodes,pNode,nNodes);
      uVar1 = *(uint *)pNode;
    }
    uVar4 = uVar4 + (uVar1 >> 8) + (uVar1 >> 4 & 0xf) + 6;
  }
  return vNodes;
}

Assistant:

Vec_Ptr_t * Cof_ManCollectHighFanout( Cof_Man_t * p, int nNodes )
{
    Vec_Ptr_t * vNodes;
    Cof_Obj_t * pObj;
    int i;
    vNodes = Vec_PtrAlloc( nNodes );
    Cof_ManForEachObj( p, pObj, i )
        if ( Cof_ObjIsCi(pObj) || Cof_ObjIsNode(pObj) )
            Cof_ManInsertEntry_rec( vNodes, pObj, nNodes );
    return vNodes;
}